

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter.cpp
# Opt level: O0

string * __thiscall cppcms::copy_filter::detach_abi_cxx11_(copy_filter *this)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  reference pbVar4;
  long in_RSI;
  string *in_RDI;
  iterator p;
  size_t len;
  string *result;
  string *this_00;
  _Self local_60;
  _List_node_base *local_58;
  undefined1 local_39;
  _List_node_base *local_38;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  long local_18;
  
  this_00 = in_RDI;
  std::ostream::operator<<(*(void **)(in_RSI + 0x98),std::flush<char,std::char_traits<char>>);
  booster::streambuf::reset_device();
  *(undefined1 *)(in_RSI + 0x1c8) = 1;
  plVar1 = *(long **)(in_RSI + 0x98);
  lVar3 = *(long *)(*plVar1 + -0x18);
  std::ios::rdbuf((streambuf *)(in_RSI + 0xa0 + *(long *)(*(long *)(in_RSI + 0xa0) + -0x18)));
  std::ios::rdbuf((streambuf *)((long)plVar1 + lVar3));
  local_18 = 0;
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    bVar2 = std::operator!=(&local_20,&local_30);
    if (!bVar2) break;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x46fc6d);
    lVar3 = std::__cxx11::string::size();
    local_18 = lVar3 + local_18;
    local_38 = (_List_node_base *)
               std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&local_20,0);
  }
  local_39 = 0;
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::reserve((ulong)this_00);
  local_58 = (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
  local_20._M_node = local_58;
  while( true ) {
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    bVar2 = std::operator!=(&local_20,&local_60);
    if (!bVar2) break;
    pbVar4 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x46fd05);
    std::__cxx11::string::operator+=((string *)this_00,(string *)pbVar4);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20,0);
  }
  return in_RDI;
}

Assistant:

std::string copy_filter::detach()
	{
		output_ << std::flush;
		copy_buffer_.reset_device();
		detached_ = true;
		output_.rdbuf(real_output_stream_.rdbuf(0));
		size_t len = 0;
		std::list<std::string>::iterator p;
		for(p=data_.begin();p!=data_.end();p++)
			len+=p->size();
		std::string result;
		result.reserve(len);
		for(p=data_.begin();p!=data_.end();p++)
			result+=*p;
		return result;
	}